

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gamecontext.cpp
# Opt level: O2

void __thiscall CGameContext::OnClientTeamChange(CGameContext *this,int ClientID)

{
  CProjectile *this_00;
  
  if (this->m_apPlayers[ClientID]->m_Team == -1) {
    AbortVoteOnTeamChange(this,ClientID);
  }
  for (this_00 = (CProjectile *)CGameWorld::FindFirst(&this->m_World,0);
      this_00 != (CProjectile *)0x0;
      this_00 = (CProjectile *)(this_00->super_CEntity).m_pNextTypeEntity) {
    if (this_00->m_Owner == ClientID) {
      CProjectile::LoseOwner(this_00);
    }
  }
  return;
}

Assistant:

void CGameContext::OnClientTeamChange(int ClientID)
{
	if(m_apPlayers[ClientID]->GetTeam() == TEAM_SPECTATORS)
		AbortVoteOnTeamChange(ClientID);

	// mark client's projectile has team projectile
	CProjectile *p = (CProjectile *)m_World.FindFirst(CGameWorld::ENTTYPE_PROJECTILE);
	for(; p; p = (CProjectile *)p->TypeNext())
	{
		if(p->GetOwner() == ClientID)
			p->LoseOwner();
	}
}